

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerInitForInEnumerator(Lowerer *this,Instr *instr)

{
  uint profileId_00;
  Func *this_00;
  code *pcVar1;
  bool bVar2;
  ProfiledInstr *pPVar3;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar4;
  ScriptContext *this_02;
  ThreadContext *this_03;
  Opnd *forInEnumeratorOpnd;
  RegOpnd *newSrc;
  AddrOpnd *opndArg;
  RegOpnd *forInEnumeratorRegOpnd;
  uint profileId;
  Func *func;
  EnumeratorCache *forInCache;
  Instr *instr_local;
  Lowerer *this_local;
  
  func = (Func *)0x0;
  this_00 = instr->m_func;
  bVar2 = IR::Instr::IsProfiledInstr(instr);
  if (bVar2) {
    pPVar3 = IR::Instr::AsProfiledInstr(instr);
    profileId_00 = (pPVar3->u).profileId;
    this_01 = Func::GetJITFunctionBody(instr->m_func);
    func = (Func *)JITTimeFunctionBody::GetForInCache(this_01,profileId_00);
    if (func == (Func *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x7114,"(forInCache != nullptr)","forInCache != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = Func::IsSimpleJit(this_00);
    if (!bVar2) {
      bVar2 = Func::IsOOPJIT(this_00);
      if (!bVar2) {
        this_02 = Func::GetScriptContext(this_00);
        this_03 = Js::ScriptContext::GetThreadContext(this_02);
        bVar2 = ThreadContext::IsRuntimeInTTDMode(this_03);
        if (bVar2) goto LAB_0079c157;
      }
      GenerateInitForInEnumeratorFastPath(this,instr,(EnumeratorCache *)func);
    }
  }
LAB_0079c157:
  forInEnumeratorOpnd = IR::Instr::UnlinkSrc2(instr);
  newSrc = GenerateForInEnumeratorLoad(this,forInEnumeratorOpnd,instr);
  IR::Instr::SetSrc2(instr,&newSrc->super_Opnd);
  opndArg = IR::AddrOpnd::New(func,AddrOpndKindForInCache,this_00,false,(Var)0x0);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  LowerBinaryHelperMem(this,instr,HelperOp_OP_InitForInEnumerator);
  return;
}

Assistant:

void
Lowerer::LowerInitForInEnumerator(IR::Instr * instr)
{
    Js::EnumeratorCache * forInCache = nullptr;
    Func * func = instr->m_func;
    if (instr->IsProfiledInstr())
    {
        uint profileId = instr->AsProfiledInstr()->u.profileId;
        forInCache = instr->m_func->GetJITFunctionBody()->GetForInCache(profileId);
        Assert(forInCache != nullptr);

        if (!func->IsSimpleJit()
#if ENABLE_TTD
            && (func->IsOOPJIT() || !func->GetScriptContext()->GetThreadContext()->IsRuntimeInTTDMode())
            //TODO: We will need to enable OOPJIT info to exclude this if we have a TTD Runtime
#endif
            )
        {
            GenerateInitForInEnumeratorFastPath(instr, forInCache);
        }
    }

    IR::RegOpnd * forInEnumeratorRegOpnd = GenerateForInEnumeratorLoad(instr->UnlinkSrc2(), instr);
    instr->SetSrc2(forInEnumeratorRegOpnd);
    m_lowererMD.LoadHelperArgument(instr, IR::AddrOpnd::New(forInCache, IR::AddrOpndKindForInCache, func));
    this->LowerBinaryHelperMem(instr, IR::HelperOp_OP_InitForInEnumerator);
}